

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

void __thiscall
soplex::SLUFactor<double>::solveRight
          (SLUFactor<double> *this,SSVectorBase<double> *x,SVectorBase<double> *b)

{
  pointer pdVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  
  (*this->solveTime->_vptr_Timer[3])();
  lVar3 = (long)b->memused;
  if (0 < lVar3) {
    pdVar1 = (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar2 = lVar3 + 1;
    piVar4 = &b->m_elem[lVar3 + -1].idx;
    do {
      pdVar1[*piVar4] = ((Nonzero<double> *)(piVar4 + -2))->val;
      lVar2 = lVar2 + -1;
      piVar4 = piVar4 + -4;
    } while (1 < lVar2);
  }
  SSVectorBase<double>::clear(x);
  x->setupStatus = false;
  CLUFactor<double>::solveRight
            (&this->super_CLUFactor<double>,
             (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  this->solveCount = this->solveCount + 1;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solveRight(SSVectorBase<R>& x, const SVectorBase<R>& b)  //const
{

   solveTime->start();

   vec.assign(b);
   x.clear();
   CLUFactor<R>::solveRight(x.altValues(), vec.get_ptr());

   solveCount++;
   solveTime->stop();
}